

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

VarStatus __thiscall soplex::SoPlexBase<double>::basisColStatus(SoPlexBase<double> *this,int col)

{
  VarStatus VVar1;
  double dVar2;
  
  VVar1 = ZERO;
  if ((-1 < col) &&
     (col < (this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum)) {
    if (this->_hasBasis == false) {
      dVar2 = lowerReal(this,col);
      if (dVar2 <= -this->_currentSettings->_realParamValues[6]) {
        dVar2 = upperReal(this,col);
        VVar1 = (uint)(this->_currentSettings->_realParamValues[6] <= dVar2) * 3;
      }
      else {
        VVar1 = ON_LOWER;
      }
    }
    else {
      if (this->_isRealLPLoaded == true) {
        VVar1 = SPxSolverBase<double>::getBasisColStatus(&this->_solver,col);
        return VVar1;
      }
      VVar1 = (this->_basisStatusCols).data[(uint)col];
    }
  }
  return VVar1;
}

Assistant:

typename SPxSolverBase<R>::VarStatus SoPlexBase<R>::basisColStatus(int col) const
{
   assert(col >= 0);
   assert(col < numCols());

   // if index is out of range, return nonbasic status as for a newly added unbounded column
   if(col < 0 || col >= numCols())
   {
      return SPxSolverBase<R>::ZERO;
   }
   // if no basis is available, return slack basis
   else if(!hasBasis())
   {
      if(lowerReal(col) > -realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_LOWER;
      else if(upperReal(col) < realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_UPPER;
      else
         return SPxSolverBase<R>::ZERO;
   }
   // if the real LP is loaded, ask solver
   else if(_isRealLPLoaded)
   {
      return _solver.getBasisColStatus(col);
   }
   // if the real LP is not loaded, the basis is stored in the basis arrays of this class
   else
   {
      assert(col < _basisStatusCols.size());
      return _basisStatusCols[col];
   }
}